

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O2

void pele::physics::turbinflow::TurbInflow::fill_turb_plane
               (TurbParm *a_tp,Vector<double,_std::allocator<double>_> *x,
               Vector<double,_std::allocator<double>_> *y,Real z,FArrayBox *v)

{
  Real RVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  double *pdVar15;
  pointer pdVar16;
  FArrayBox *pFVar17;
  double *pdVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  double *pdVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  undefined4 extraout_EDX;
  undefined4 uVar35;
  size_t sVar36;
  long lVar37;
  long lVar38;
  undefined1 *puVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  Real ydata [3];
  DeviceVector<amrex::Real> y_dev;
  DeviceVector<amrex::Real> x_dev;
  int local_c8;
  int iStack_c4;
  undefined1 local_78 [16];
  double local_68 [7];
  
  dVar48 = (a_tp->dx).arr[2];
  if ((z < dVar48 * 0.5 + a_tp->szlo) || (dVar48 * -0.5 + a_tp->szhi < z)) {
    read_turb_planes(a_tp,z);
  }
  pdVar15 = (v->super_BaseFab<double>).dptr;
  iVar3 = (v->super_BaseFab<double>).domain.smallend.vect[0];
  iVar4 = (v->super_BaseFab<double>).domain.smallend.vect[1];
  iVar5 = (v->super_BaseFab<double>).domain.smallend.vect[2];
  iVar6 = (v->super_BaseFab<double>).domain.bigend.vect[0];
  iVar7 = (v->super_BaseFab<double>).domain.bigend.vect[1];
  iVar8 = (v->super_BaseFab<double>).domain.bigend.vect[2];
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (&x_dev,(long)(x->super_vector<double,_std::allocator<double>_>).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(x->super_vector<double,_std::allocator<double>_>).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3);
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (&y_dev,(long)(y->super_vector<double,_std::allocator<double>_>).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(y->super_vector<double,_std::allocator<double>_>).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3);
  pdVar16 = (x->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  sVar36 = (long)(x->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish - (long)pdVar16;
  if (sVar36 != 0) {
    memcpy(x_dev.m_data,pdVar16,sVar36);
  }
  lVar27 = (long)((iVar6 - iVar3) + 1);
  pdVar16 = (y->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  sVar36 = (long)(y->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish - (long)pdVar16;
  if (sVar36 != 0) {
    memcpy(y_dev.m_data,pdVar16,sVar36);
  }
  lVar28 = ((iVar7 - iVar4) + 1) * lVar27;
  RVar1 = a_tp->turb_scale_vel;
  uVar46 = (uint)((ulong)RVar1 >> 0x20);
  if (a_tp->side == high) {
    uVar46 = uVar46 ^ 0x80000000;
  }
  pFVar17 = a_tp->sdata;
  pdVar18 = (pFVar17->super_BaseFab<double>).dptr;
  iVar6 = (pFVar17->super_BaseFab<double>).domain.smallend.vect[0];
  iVar7 = (pFVar17->super_BaseFab<double>).domain.smallend.vect[1];
  iVar9 = (pFVar17->super_BaseFab<double>).domain.smallend.vect[2];
  iVar10 = (pFVar17->super_BaseFab<double>).domain.bigend.vect[2];
  lVar38 = (long)(((pFVar17->super_BaseFab<double>).domain.bigend.vect[0] - iVar6) + 1);
  lVar44 = (((pFVar17->super_BaseFab<double>).domain.bigend.vect[1] - iVar7) + 1) * lVar38;
  iVar11 = (v->super_BaseFab<double>).domain.smallend.vect[0];
  lVar29 = (long)(v->super_BaseFab<double>).domain.smallend.vect[1];
  dVar22 = (a_tp->pboxlo).arr[0];
  dVar23 = (a_tp->pboxlo).arr[1];
  dVar24 = (a_tp->dxinv).arr[0];
  dVar25 = (a_tp->dxinv).arr[1];
  uVar2 = *(undefined8 *)(a_tp->npboxcells).arr;
  iVar45 = (v->super_BaseFab<double>).domain.smallend.vect[2];
  dVar48 = (z - a_tp->szlo) * (a_tp->dxinv).arr[2];
  iVar12 = (v->super_BaseFab<double>).domain.bigend.vect[0];
  iVar13 = (v->super_BaseFab<double>).domain.bigend.vect[1];
  iVar14 = (v->super_BaseFab<double>).domain.bigend.vect[2];
  dVar49 = round(dVar48);
  dVar48 = dVar48 - (double)(int)dVar49;
  iVar26 = (int)dVar49 - iVar9;
  for (lVar30 = (long)iVar45; lVar30 <= iVar14; lVar30 = lVar30 + 1) {
    for (lVar34 = lVar29; lVar34 <= iVar13; lVar34 = lVar34 + 1) {
      if (iVar11 <= iVar12) {
        lVar33 = (long)iVar11;
        do {
          for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
            dVar49 = (x_dev.m_data[lVar33 - iVar11] - dVar22) * dVar24;
            dVar50 = (y_dev.m_data[lVar34 - lVar29] - dVar23) * dVar25;
            auVar19._8_4_ = SUB84(dVar50,0);
            auVar19._0_8_ = dVar49;
            auVar19._12_4_ = (int)((ulong)dVar50 >> 0x20);
            dVar50 = round(dVar49);
            dVar21 = round(auVar19._8_8_);
            iVar45 = (int)dVar50;
            iVar47 = (int)dVar21;
            if (-1 < iVar45) {
              local_c8 = (int)uVar2;
              iStack_c4 = (int)((ulong)uVar2 >> 0x20);
              auVar20._4_4_ = -(uint)(iVar45 < local_c8);
              auVar20._0_4_ = -(uint)(iVar45 < local_c8);
              auVar20._8_4_ = -(uint)(iVar47 < iStack_c4);
              auVar20._12_4_ = -(uint)(iVar47 < iStack_c4);
              uVar35 = movmskpd(extraout_EDX,auVar20);
              if ((byte)(-1 < iVar47 & (byte)uVar35 & (byte)uVar35 >> 1) == 1) {
                dVar49 = dVar49 - (double)iVar45;
                dVar50 = auVar19._8_8_ - (double)iVar47;
                lVar37 = ((iVar10 - iVar9) + 1) * lVar44 * lVar32;
                puVar39 = local_78;
                for (lVar40 = 0; lVar40 != 3; lVar40 = lVar40 + 1) {
                  lVar41 = (long)((iVar45 - iVar6) + 2 + (int)lVar40);
                  for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
                    lVar43 = (iVar47 + (2 - iVar7) + (int)lVar42) * lVar38;
                    *(double *)(puVar39 + lVar42 * 8) =
                         pdVar18[lVar41 + lVar43 + (iVar26 + 2) * lVar44 + lVar37] *
                         dVar48 * 0.5 * (dVar48 + -1.0) +
                         pdVar18[lVar41 + lVar43 + lVar44 * iVar26 + lVar37] *
                         (dVar48 + -2.0) * (dVar48 + -1.0) * 0.5 +
                         pdVar18[lVar41 + lVar43 + (iVar26 + 1) * lVar44 + lVar37] *
                         (2.0 - dVar48) * dVar48;
                  }
                  puVar39 = puVar39 + 0x18;
                }
                pdVar31 = local_68;
                for (lVar37 = 0; lVar37 != 3; lVar37 = lVar37 + 1) {
                  ydata[lVar37] =
                       *pdVar31 * dVar50 * 0.5 * (dVar50 + -1.0) +
                       pdVar31[-2] * (dVar50 + -2.0) * (dVar50 + -1.0) * 0.5 +
                       pdVar31[-1] * (2.0 - dVar50) * dVar50;
                  pdVar31 = pdVar31 + 3;
                }
                pdVar15[(lVar30 - iVar5) * lVar28 +
                        (lVar34 - iVar4) * lVar27 +
                        (lVar33 - iVar3) + ((iVar8 - iVar5) + 1) * lVar28 * lVar32] =
                     (dVar49 * 0.5 * (dVar49 + -1.0) * ydata[2] +
                     (dVar49 + -2.0) * (dVar49 + -1.0) * 0.5 * ydata[0] +
                     (2.0 - dVar49) * dVar49 * ydata[1]) * (double)CONCAT44(uVar46,SUB84(RVar1,0));
              }
            }
          }
          lVar33 = lVar33 + 1;
        } while (iVar12 + 1 != (int)lVar33);
      }
    }
  }
  amrex::Gpu::Device::synchronize();
  amrex::PODVector<double,_std::allocator<double>_>::~PODVector(&y_dev);
  amrex::PODVector<double,_std::allocator<double>_>::~PODVector(&x_dev);
  return;
}

Assistant:

void
TurbInflow::fill_turb_plane(
  TurbParm& a_tp,
  const amrex::Vector<amrex::Real>& x,
  const amrex::Vector<amrex::Real>& y,
  amrex::Real z,
  amrex::FArrayBox& v)
{
  if (
    (z < a_tp.szlo + 0.5 * a_tp.dx[2]) || (z > a_tp.szhi - 0.5 * a_tp.dx[2])) {
#if 0
    {
      amrex::AllPrint() << "Reading new data because z " << z << " is outside " << a_tp.szlo + 0.5 * a_tp.dx[2] << " and "
                     << a_tp.szhi - 0.5 * a_tp.dx[2] << std::endl;
    }
#endif
    read_turb_planes(a_tp, z);
  }

  const auto& bx = v.box();
  const auto& vd = v.array();

  amrex::Gpu::DeviceVector<amrex::Real> x_dev(x.size());
  amrex::Gpu::DeviceVector<amrex::Real> y_dev(y.size());
  amrex::Gpu::copyAsync(
    amrex::Gpu::hostToDevice, x.begin(), x.end(), x_dev.begin());
  amrex::Gpu::copyAsync(
    amrex::Gpu::hostToDevice, y.begin(), y.end(), y_dev.begin());
  amrex::Real* xd = x_dev.data();
  amrex::Real* yd = y_dev.data();

  amrex::Real velScale = (a_tp.side == amrex::Orientation::high)
                           ? -a_tp.turb_scale_vel
                           : a_tp.turb_scale_vel;
  const auto& npboxcells = a_tp.npboxcells;
  const auto& pboxlo = a_tp.pboxlo;
  const auto& szlo = a_tp.szlo;
  const auto& dxinv = a_tp.dxinv;
  const auto& sd = a_tp.sdata->array();

  amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE(int i, int j, int k) noexcept {
    amrex::Real cx[3], cy[3], cz[3], ydata[3];
    amrex::Real zdata[3][3];

    amrex::Real zz =
      (z - szlo) * dxinv[2];        // How many dz away from the left side ?
    int k0 = (int)(std::round(zz)); // What's the closest point ?
    zz -= amrex::Real(k0);
    cz[0] = 0.5 * (zz - 1.0) * (zz - 2.0); // Weight of k0 - 1
    cz[1] = zz * (2.0 - zz);               // Weight of k0
    cz[2] = 0.5 * zz * (zz - 1.0);         // Weight of k0 + 1
    k0 += 1;                               // Index starting at 1

    for (int n = 0; n < AMREX_SPACEDIM; ++n) {
      amrex::Real xx = (xd[i - bx.smallEnd(0)] - pboxlo[0]) * dxinv[0];
      amrex::Real yy = (yd[j - bx.smallEnd(1)] - pboxlo[1]) * dxinv[1];
      int i0 = (int)(std::round(xx));
      int j0 = (int)(std::round(yy));
      xx -= amrex::Real(i0);
      yy -= amrex::Real(j0);
      cx[0] = 0.5 * (xx - 1.0) * (xx - 2.0);
      cy[0] = 0.5 * (yy - 1.0) * (yy - 2.0);
      cx[1] = xx * (2.0 - xx);
      cy[1] = yy * (2.0 - yy);
      cx[2] = 0.5 * xx * (xx - 1.0);
      cy[2] = 0.5 * yy * (yy - 1.0);

      if (i0 >= 0 && i0 < npboxcells[0] && j0 >= 0 && j0 < npboxcells[1]) {
        i0 += 2;
        j0 += 2;
        for (int ii = 0; ii <= 2; ++ii) {
          for (int jj = 0; jj <= 2; ++jj) {
            zdata[ii][jj] = cz[0] * sd(i0 + ii, j0 + jj, k0 - 1, n) +
                            cz[1] * sd(i0 + ii, j0 + jj, k0, n) +
                            cz[2] * sd(i0 + ii, j0 + jj, k0 + 1, n);
          }
        }
        for (int ii = 0; ii <= 2; ++ii) {
          ydata[ii] =
            cy[0] * zdata[ii][0] + cy[1] * zdata[ii][1] + cy[2] * zdata[ii][2];
        }
        vd(i, j, k, n) = cx[0] * ydata[0] + cx[1] * ydata[1] + cx[2] * ydata[2];
        vd(i, j, k, n) *= velScale;
      }
    }
  });
  amrex::Gpu::synchronize(); // Ensure that DeviceVector's don't leave scope
                             // early
}